

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_IADD_RS(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint32_t val;
  int in_EDX;
  Instruction *in_RSI;
  JitCompilerX86 *in_RDI;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  in_RDI->registerUsage[in_RSI->dst] = in_EDX;
  emit<2ul>(in_RDI,(uint8_t (*) [2])CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (in_RSI->dst == '\x05') {
    emitByte(in_RDI,0xac);
  }
  else {
    emitByte(in_RDI,in_RSI->dst * '\b' + '\x04');
  }
  Instruction::getModShift(in_RSI);
  genSIB(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
  if (in_RSI->dst == '\x05') {
    val = Instruction::getImm32((Instruction *)0x12a274);
    emit32(in_RDI,val);
  }
  return;
}

Assistant:

void JitCompilerX86::h_IADD_RS(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		emit(REX_LEA);
		if (instr.dst == RegisterNeedsDisplacement)
			emitByte(0xac);
		else
			emitByte(0x04 + 8 * instr.dst);
		genSIB(instr.getModShift(), instr.src, instr.dst);
		if (instr.dst == RegisterNeedsDisplacement)
			emit32(instr.getImm32());
	}